

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void QueueResult(TResult *result)

{
  uchar *__src;
  void *in_RDI;
  long *in_FS_OFFSET;
  
  __src = RngStream::GetDigest(*(RngStream **)(*in_FS_OFFSET + -0xe0));
  memcpy(in_RDI,__src,0x30);
  pthread_mutex_lock((pthread_mutex_t *)&gPipeLock);
  write(gPipe[1],in_RDI,0x834);
  pthread_mutex_unlock((pthread_mutex_t *)&gPipeLock);
  return;
}

Assistant:

void QueueResult(TResult * result)
{
    /* Set our ID first, and send to write thread */
    memcpy(result->fId, tRand->GetDigest(), sizeof(TResult::fId));
    pthread_mutex_lock(&gPipeLock);
    /* Note regarding valgrind: valgrind will complain because of a call to write()
     * referencing non-initialized memory. This is to be expected: the TResult is allocated
     * from stack and is only initialized with meaningful data. Furthermore, when going to
     * disk, only relevant bits will be written. So, for performances reasons, we don't zero
     * the stack object, and tolerate valgrind complain.
     */
    UNUSED_RETURN(write(gPipe[1], result, sizeof(TResult)));
    pthread_mutex_unlock(&gPipeLock);
}